

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O2

bool __thiscall DyndepParser::ParseDyndepVersion(DyndepParser *this,string *err)

{
  bool bVar1;
  int minor;
  int major;
  string version;
  EvalString let_value;
  string name;
  allocator<char> local_e1;
  int local_e0;
  int local_dc;
  string local_d8;
  EvalString local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_b8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ParseLet(this,&local_78,&local_b8,err);
  if (bVar1) {
    bVar1 = std::operator!=(&local_78,"ninja_dyndep_version");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"expected \'ninja_dyndep_version = ...\'",
                 (allocator<char> *)&local_98);
      bVar1 = Lexer::Error(&(this->super_Parser).lexer_,&local_d8,err);
    }
    else {
      EvalString::Evaluate_abi_cxx11_(&local_d8,&local_b8,&(this->env_).super_Env);
      ParseVersion(&local_d8,&local_dc,&local_e0);
      if ((local_dc != 1) || (bVar1 = true, local_e0 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"unsupported \'ninja_dyndep_version = ",&local_e1);
        std::operator+(&local_38,&local_58,&local_d8);
        std::operator+(&local_98,&local_38,"\'");
        bVar1 = Lexer::Error(&(this->super_Parser).lexer_,&local_98,err);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_b8.parsed_);
  std::__cxx11::string::~string((string *)&local_78);
  return bVar1;
}

Assistant:

bool DyndepParser::ParseDyndepVersion(string* err) {
  string name;
  EvalString let_value;
  if (!ParseLet(&name, &let_value, err))
    return false;
  if (name != "ninja_dyndep_version") {
    return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
  }
  string version = let_value.Evaluate(&env_);
  int major, minor;
  ParseVersion(version, &major, &minor);
  if (major != 1 || minor != 0) {
    return lexer_.Error(
      string("unsupported 'ninja_dyndep_version = ") + version + "'", err);
    return false;
  }
  return true;
}